

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * __thiscall
soul::Value::toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)::
Value_const__(Value *__return_storage_ptr__,void *this,Value *source)

{
  long *plVar1;
  ConstantTable *this_00;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *index;
  bool bVar2;
  int32_t v;
  Type *this_01;
  int64_t v_00;
  ArraySize AVar3;
  Handle handle;
  anon_class_16_2_536b3816 *getValueForIndex;
  string *this_02;
  anon_class_8_1_6bb45959 *in_RCX;
  float v_01;
  double v_02;
  undefined1 auVar4 [16];
  string_view sVar5;
  SubElementPath local_1e0;
  Value local_1a8;
  Value local_168;
  string_view local_100;
  Member *local_f0;
  Member *m;
  Member *__end3;
  Member *__begin3;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *__range3;
  size_t i;
  char *local_c0;
  undefined1 local_b1;
  Structure *local_b0;
  Structure *s;
  Value *local_a0;
  Value *local_98;
  Value *target;
  Value *local_88;
  Value *local_80;
  Value *local_78;
  int local_70;
  Value *local_60;
  undefined1 local_58 [8];
  Type elementType;
  uint32_t size;
  Type *sourceType;
  Value *source_local;
  ConversionState *this_local;
  Value *o;
  
  this_01 = getType(source);
  bVar2 = Type::isPrimitive(this_01);
  if (bVar2) {
    bVar2 = Type::isInteger32(this_01);
    if (bVar2) {
      v = getAsInt32(source);
      choc::value::createInt32(__return_storage_ptr__,v);
      return __return_storage_ptr__;
    }
    bVar2 = Type::isInteger64(this_01);
    if (bVar2) {
      v_00 = getAsInt64(source);
      choc::value::createInt64(__return_storage_ptr__,v_00);
      return __return_storage_ptr__;
    }
    bVar2 = Type::isFloat32(this_01);
    if (bVar2) {
      v_01 = getAsFloat(source);
      choc::value::createFloat32(__return_storage_ptr__,v_01);
      return __return_storage_ptr__;
    }
    bVar2 = Type::isFloat64(this_01);
    if (bVar2) {
      v_02 = getAsDouble(source);
      choc::value::createFloat64(__return_storage_ptr__,v_02);
      return __return_storage_ptr__;
    }
    bVar2 = Type::isBool(this_01);
    if (bVar2) {
      bVar2 = getAsBool(source);
      choc::value::createBool(__return_storage_ptr__,bVar2);
      return __return_storage_ptr__;
    }
  }
  bVar2 = Type::isStringLiteral(this_01);
  if (bVar2) {
    plVar1 = *(long **)((long)this + 8);
    elementType.structure.object._4_4_ = getStringLiteral(source);
    auVar4 = (**(code **)(*plVar1 + 0x18))(plVar1,elementType.structure.object._4_4_);
    sVar5._M_len = auVar4._8_8_;
    sVar5._M_str = (char *)in_RCX;
    choc::value::createString(__return_storage_ptr__,auVar4._0_8_,sVar5);
  }
  else {
    bVar2 = Type::isVector(this_01);
    if (bVar2) {
      AVar3 = Type::getVectorSize(this_01);
      elementType.structure.object._0_4_ = (uint)AVar3;
      Type::getElementType((Type *)local_58,this_01);
      bVar2 = Type::isInteger32((Type *)local_58);
      if (bVar2) {
        local_60 = source;
        choc::value::
        createVector<soul::Value::toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)const::ConversionState::convert(soul::Value_const&)::_lambda(unsigned_int)_1_>
                  (__return_storage_ptr__,(value *)(ulong)(uint)elementType.structure.object,
                   (uint32_t)&local_60,in_RCX);
        local_70 = 1;
      }
      else {
        bVar2 = Type::isInteger64((Type *)local_58);
        if (bVar2) {
          local_78 = source;
          choc::value::
          createVector<soul::Value::toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)const::ConversionState::convert(soul::Value_const&)::_lambda(unsigned_int)_2_>
                    (__return_storage_ptr__,(value *)(ulong)(uint)elementType.structure.object,
                     (uint32_t)&local_78,in_RCX);
          local_70 = 1;
        }
        else {
          bVar2 = Type::isFloat32((Type *)local_58);
          if (bVar2) {
            local_80 = source;
            choc::value::
            createVector<soul::Value::toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)const::ConversionState::convert(soul::Value_const&)::_lambda(unsigned_int)_3_>
                      (__return_storage_ptr__,(value *)(ulong)(uint)elementType.structure.object,
                       (uint32_t)&local_80,in_RCX);
            local_70 = 1;
          }
          else {
            bVar2 = Type::isFloat64((Type *)local_58);
            if (bVar2) {
              local_88 = source;
              choc::value::
              createVector<soul::Value::toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)const::ConversionState::convert(soul::Value_const&)::_lambda(unsigned_int)_4_>
                        (__return_storage_ptr__,(value *)(ulong)(uint)elementType.structure.object,
                         (uint32_t)&local_88,in_RCX);
              local_70 = 1;
            }
            else {
              bVar2 = Type::isBool((Type *)local_58);
              if (bVar2) {
                target = source;
                choc::value::
                createVector<soul::Value::toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)const::ConversionState::convert(soul::Value_const&)::_lambda(unsigned_int)_5_>
                          (__return_storage_ptr__,(value *)(ulong)(uint)elementType.structure.object
                           ,(uint32_t)&target,in_RCX);
                local_70 = 1;
              }
              else {
                local_70 = 0;
              }
            }
          }
        }
      }
      Type::~Type((Type *)local_58);
      if (local_70 != 0) {
        return __return_storage_ptr__;
      }
    }
    bVar2 = Type::isUnsizedArray(this_01);
    if (bVar2) {
      this_00 = *this;
      handle = getUnsizedArrayContent(source);
      local_98 = ConstantTable::getValueForHandle(this_00,handle);
      checkAssertion(local_98 != (Value *)0x0,"target != nullptr","convert",0x379);
      Value_const__(__return_storage_ptr__,this,local_98);
    }
    else {
      bVar2 = Type::isArray(this_01);
      if (bVar2) {
        getValueForIndex = (anon_class_16_2_536b3816 *)Type::getArraySize(this_01);
        s = (Structure *)this;
        local_a0 = source;
        choc::value::
        createArray<soul::Value::toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)const::ConversionState::convert(soul::Value_const&)::_lambda(unsigned_int)_6_>
                  (__return_storage_ptr__,(value *)((ulong)getValueForIndex & 0xffffffff),
                   (uint32_t)&s,getValueForIndex);
      }
      else {
        bVar2 = Type::isStruct(this_01);
        if (!bVar2) {
          throwInternalCompilerError("convert",0x38d);
        }
        local_b0 = Type::getStructRef(this_01);
        local_b1 = 0;
        this_02 = Structure::getName_abi_cxx11_(local_b0);
        sVar5 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_02);
        local_c0 = sVar5._M_str;
        i = sVar5._M_len;
        choc::value::createObject(__return_storage_ptr__,sVar5);
        __range3 = (ArrayWithPreallocation<soul::Structure::Member,_8UL> *)0x0;
        __begin3 = (Member *)Structure::getMembers(local_b0);
        __end3 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::begin
                           ((ArrayWithPreallocation<soul::Structure::Member,_8UL> *)__begin3);
        m = ArrayWithPreallocation<soul::Structure::Member,_8UL>::end
                      ((ArrayWithPreallocation<soul::Structure::Member,_8UL> *)__begin3);
        for (; __end3 != m; __end3 = __end3 + 1) {
          local_f0 = __end3;
          sVar5 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__end3->name);
          index = __range3;
          __range3 = (ArrayWithPreallocation<soul::Structure::Member,_8UL> *)
                     ((long)&__range3->items + 1);
          local_100 = sVar5;
          SubElementPath::SubElementPath(&local_1e0,(size_t)index);
          getSubElement(&local_1a8,source,&local_1e0);
          Value_const__(&local_168,this,&local_1a8);
          choc::value::Value::addMember<choc::value::Value>
                    (__return_storage_ptr__,local_100,&local_168);
          choc::value::Value::~Value(&local_168);
          ~Value(&local_1a8);
          SubElementPath::~SubElementPath(&local_1e0);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value convert (const Value& source)
        {
            const auto& sourceType = source.getType();

            if (sourceType.isPrimitive())
            {
                if (sourceType.isInteger32())   return choc::value::createInt32 (source.getAsInt32());
                if (sourceType.isInteger64())   return choc::value::createInt64 (source.getAsInt64());
                if (sourceType.isFloat32())     return choc::value::createFloat32 (source.getAsFloat());
                if (sourceType.isFloat64())     return choc::value::createFloat64 (source.getAsDouble());
                if (sourceType.isBool())        return choc::value::createBool (source.getAsBool());
            }

            if (sourceType.isStringLiteral())
                return choc::value::createString (dictionary.getStringForHandle (source.getStringLiteral()));

            if (sourceType.isVector())
            {
                auto size = static_cast<uint32_t> (sourceType.getVectorSize());
                auto elementType = sourceType.getElementType();

                if (elementType.isInteger32())   return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsInt32(); });
                if (elementType.isInteger64())   return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsInt64(); });
                if (elementType.isFloat32())     return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsFloat(); });
                if (elementType.isFloat64())     return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsDouble(); });
                if (elementType.isBool())        return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsBool(); });
            }

            if (sourceType.isUnsizedArray())
            {
                auto target = constants.getValueForHandle (source.getUnsizedArrayContent());
                SOUL_ASSERT (target != nullptr);
                return convert (*target);
            }

            if (sourceType.isArray())
                return choc::value::createArray (static_cast<uint32_t> (sourceType.getArraySize()),
                                                 [&] (uint32_t i) { return convert (source.getSubElement (i)); });

            if (sourceType.isStruct())
            {
                auto& s = sourceType.getStructRef();
                auto o = choc::value::createObject (s.getName());
                size_t i = 0;

                for (auto& m : s.getMembers())
                    o.addMember (m.name, convert (source.getSubElement (i++)));

                return o;
            }

            SOUL_ASSERT_FALSE;
            return {};
        }